

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

ssize_t __thiscall
CVmByteArraySource::write(CVmByteArraySource *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  
  lVar1 = this->idx;
  pvVar2 = (void *)(this->end_idx - lVar1);
  if (lVar1 + (long)__buf <= this->end_idx) {
    pvVar2 = __buf;
  }
  pvVar2 = (void *)CVmObjByteArray::copy_from_buf_undo
                             (this->arr,this->arr_id,(uchar *)CONCAT44(in_register_00000034,__fd),
                              lVar1 + 1,(size_t)pvVar2);
  this->idx = this->idx + (long)pvVar2;
  return (ulong)(pvVar2 != __buf);
}

Assistant:

virtual int write(const void *buf, size_t len)
    {
        /* establish global access */
        VMGLOB_PTR(vmg);
        
        /* limit the write to the available length */
        size_t wrtlen = (idx + (long)len > end_idx
                         ? (size_t)(end_idx - idx) : len);

        /* copy the requested bytes (saving undo) */
        size_t copied = arr->copy_from_buf_undo(
            vmg_ arr_id, (const unsigned char *)buf, idx + 1, wrtlen);

        /* move past the bytes copied */
        idx += copied;

        /* we were successful if we copied exactly the requested length */
        return copied != len;
    }